

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::optimizeMemoryAccess
          (OptimizeInstructions *this,Expression **ptr,Address *offset,Name memory)

{
  ulong uVar1;
  Memory *pMVar2;
  Literal *this_00;
  anon_union_16_6_1532cd5a_for_Literal_0 local_58;
  undefined8 local_48;
  Address *local_40;
  ulong local_38;
  
  if ((*ptr)->_id == ConstId) {
    this_00 = (Literal *)(*ptr + 1);
    local_40 = offset;
    uVar1 = Literal::getInteger(this_00);
    local_38 = local_40->addr;
    pMVar2 = Module::getMemory((this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).
                               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .
                               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .currModule,memory);
    if ((pMVar2->addressType).id == 3) {
      local_58.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(uVar1 + local_38);
      if (CARRY8(uVar1,local_38)) {
        return;
      }
      local_48 = 3;
      Literal::operator=(this_00,(Literal *)&local_58.func);
    }
    else {
      if (0x7fffffff < local_38 || 0x7fffffff < uVar1) {
        return;
      }
      if (0x7fffffff < local_38 + uVar1) {
        return;
      }
      local_58.i32 = (int)(local_38 + uVar1);
      local_48 = 2;
      Literal::operator=(this_00,(Literal *)&local_58.func);
    }
    Literal::~Literal((Literal *)&local_58.func);
    local_40->addr = 0;
  }
  return;
}

Assistant:

void optimizeMemoryAccess(Expression*& ptr, Address& offset, Name memory) {
    // ptr may be a const, but it isn't worth folding that in (we still have a
    // const); in fact, it's better to do the opposite for gzip purposes as well
    // as for readability.
    auto* last = ptr->dynCast<Const>();
    if (last) {
      uint64_t value64 = last->value.getInteger();
      uint64_t offset64 = offset;
      auto mem = getModule()->getMemory(memory);
      if (mem->is64()) {
        // Check for a 64-bit overflow.
        uint64_t sum;
        if (!std::ckd_add(&sum, value64, offset64)) {
          last->value = Literal(int64_t(sum));
          offset = 0;
        }
      } else {
        // don't do this if it would wrap the pointer
        if (value64 <= uint64_t(std::numeric_limits<int32_t>::max()) &&
            offset64 <= uint64_t(std::numeric_limits<int32_t>::max()) &&
            value64 + offset64 <=
              uint64_t(std::numeric_limits<int32_t>::max())) {
          last->value = Literal(int32_t(value64 + offset64));
          offset = 0;
        }
      }
    }
  }